

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

scalar __thiscall
absl::make_unique<S2Polyline::Shape,S2Polyline_const*>(absl *this,S2Polyline **args)

{
  Shape *this_00;
  
  this_00 = (Shape *)operator_new(0x18);
  S2Polyline::Shape::Shape(this_00,*args);
  *(Shape **)this = this_00;
  return (__uniq_ptr_data<S2Polyline::Shape,_std::default_delete<S2Polyline::Shape>,_true,_true>)
         (__uniq_ptr_data<S2Polyline::Shape,_std::default_delete<S2Polyline::Shape>,_true,_true>)
         this;
}

Assistant:

typename memory_internal::MakeUniqueResult<T>::scalar make_unique(
    Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}